

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::CalculateNumLeavesNumLCA(GeneralizedSuffixTree *this,Node *node)

{
  __node_base *p_Var1;
  
  p_Var1 = &(node->edges)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (*(int *)(p_Var1 + 4) == 0) {
      node->num_leaves = node->num_leaves + 1;
    }
    else {
      CalculateNumLeavesNumLCA
                (this,*(Node **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
      node->num_leaves =
           node->num_leaves +
           *(int *)&(*(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)[4]._M_nxt;
      node->num_lca =
           node->num_lca +
           *(int *)((long)&(*(_Hash_node_base **)
                             &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)[4]._M_nxt
                   + 4);
    }
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::CalculateNumLeavesNumLCA (Node *node)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
        {
            CalculateNumLeavesNumLCA (edge_pair.second.node);
            node->num_leaves += edge_pair.second.node->num_leaves;
            node->num_lca += edge_pair.second.node->num_lca;
        }
        else
            ++node->num_leaves;
}